

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O1

uint32_t aeron::BufferBuilder::findSuitableCapacity
                   (uint32_t currentCapacity,uint32_t requiredCapacity)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  SourcedException *this;
  char *pcVar4;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar3 = (ulong)currentCapacity;
  while( true ) {
    uVar1 = (uint)(uVar3 >> 1);
    uVar2 = uVar1 + currentCapacity;
    uVar3 = (ulong)uVar2;
    if ((!(bool)(~CARRY4(uVar1,currentCapacity) & uVar2 < 0xfffffff8)) &&
       (uVar3 = 0xfffffff7, currentCapacity == 0xfffffff7)) break;
    currentCapacity = (uint32_t)uVar3;
    if (requiredCapacity <= currentCapacity) {
      return currentCapacity;
    }
  }
  this = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_60,0xfffffff7);
  std::operator+(&local_40,"max capacity reached: ",&local_60);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "static std::uint32_t aeron::BufferBuilder::findSuitableCapacity(std::uint32_t, std::uint32_t)"
             ,"");
  pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/BufferBuilder.h"
                            );
  std::__cxx11::string::string((string *)&local_80,pcVar4,&local_a1);
  util::SourcedException::SourcedException(this,&local_40,&local_a0,&local_80,0x68);
  *(undefined ***)this = &PTR__SourcedException_00163468;
  __cxa_throw(this,&util::IllegalStateException::typeinfo,util::SourcedException::~SourcedException)
  ;
}

Assistant:

inline static std::uint32_t findSuitableCapacity(std::uint32_t currentCapacity, std::uint32_t requiredCapacity)
    {
        std::uint32_t capacity = currentCapacity;

        do
        {
            const std::uint32_t newCapacity = capacity + (capacity >> 1);

            if (newCapacity < capacity || newCapacity > BUFFER_BUILDER_MAX_CAPACITY)
            {
                if (capacity == BUFFER_BUILDER_MAX_CAPACITY)
                {
                    throw util::IllegalStateException(
                        "max capacity reached: " + std::to_string(BUFFER_BUILDER_MAX_CAPACITY), SOURCEINFO);
                }

                capacity = BUFFER_BUILDER_MAX_CAPACITY;
            }
            else
            {
                capacity = newCapacity;
            }
        }
        while (capacity < requiredCapacity);

        return capacity;
    }